

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_intpl.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  ifstream *input_stream;
  bool bVar6;
  int vector_length;
  allocator local_501;
  string local_500;
  double magic_number;
  vector<double,_std::allocator<double>_> data;
  ostringstream error_message_5;
  InputSourceFromStream input_source;
  InputSourceFillingMagicNumber input_source_filling_magic_number;
  ifstream ifs;
  byte abStack_260 [488];
  option long_options [2];
  
  vector_length = 1;
  magic_number = 0.0;
  long_options[1].flag = (int *)0x0;
  long_options[1].val = 0;
  long_options[1]._28_4_ = 0;
  long_options[1].name = (char *)0x0;
  long_options[1].has_arg = 0;
  long_options[1]._12_4_ = 0;
  long_options[0].flag = (int *)0x0;
  long_options[0].val = 1000;
  long_options[0]._28_4_ = 0;
  long_options[0].name = "magic";
  long_options[0].has_arg = 1;
  long_options[0]._12_4_ = 0;
LAB_00103637:
  do {
    while (iVar3 = ya_getopt_long_only(argc,argv,"l:m:h",long_options,(int *)0x0), iVar3 == 0x6c) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar6 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
      bVar1 = vector_length < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar6 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string
                  ((string *)&error_message_5,"magic_intpl",
                   (allocator *)&input_source_filling_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_001039bb:
        std::__cxx11::string::~string((string *)&error_message_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
    if (iVar3 == 0x6d) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
      bVar6 = vector_length < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::__cxx11::string::string
                  ((string *)&error_message_5,"magic_intpl",
                   (allocator *)&input_source_filling_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001039bb;
      }
      vector_length = vector_length + 1;
      goto LAB_00103637;
    }
    if (iVar3 != 1000) {
      if (iVar3 != -1) {
        if (iVar3 != 0x68) {
          anon_unknown.dwarf_2eab::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        anon_unknown.dwarf_2eab::PrintUsage((ostream *)&std::cout);
        return 0;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string
                  ((string *)&error_message_5,"magic_intpl",
                   (allocator *)&input_source_filling_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001039bb;
      }
      if (argc == ya_optind) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Cannot set translation mode");
        std::__cxx11::string::string
                  ((string *)&error_message_5,"magic_intpl",
                   (allocator *)&input_source_filling_magic_number);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001039bb;
      }
      input_stream = &ifs;
      std::ifstream::ifstream(input_stream);
      if ((pcVar5 == (char *)0x0) ||
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
         (abStack_260[*(long *)(_ifs + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          input_stream = (ifstream *)&std::cin;
        }
        sptk::InputSourceFromStream::InputSourceFromStream
                  (&input_source,false,vector_length,(istream *)input_stream);
        if (input_source.is_valid_ != false) {
          sptk::InputSourceFillingMagicNumber::InputSourceFillingMagicNumber
                    (&input_source_filling_magic_number,magic_number,
                     &input_source.super_InputSourceInterface);
          if (input_source_filling_magic_number.is_valid_ != false) {
            data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage = (pointer)0x0;
            data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)0x0;
            data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_finish = (pointer)0x0;
            break;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
          std::operator<<((ostream *)&error_message_5,
                          "Failed to initialize InputSourceFillingMagicNumber");
          std::__cxx11::string::string((string *)&local_500,"magic_intpl",(allocator *)&data);
          sptk::PrintErrorMessage(&local_500,&error_message_5);
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
          iVar3 = 1;
          goto LAB_00103bb9;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,"Failed to initialize InputSourceFromStream");
        std::__cxx11::string::string
                  ((string *)&input_source_filling_magic_number,"magic_intpl",
                   (allocator *)&local_500);
        sptk::PrintErrorMessage((string *)&input_source_filling_magic_number,&error_message_5);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        poVar4 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
        std::operator<<(poVar4,pcVar5);
        std::__cxx11::string::string
                  ((string *)&input_source_filling_magic_number,"magic_intpl",
                   (allocator *)&input_source);
        sptk::PrintErrorMessage((string *)&input_source_filling_magic_number,&error_message_5);
      }
      std::__cxx11::string::~string((string *)&input_source_filling_magic_number);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
      iVar3 = 1;
      goto LAB_00103bc6;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
    bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&magic_number);
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -magic option must be a number");
      std::__cxx11::string::string
                ((string *)&error_message_5,"magic_intpl",
                 (allocator *)&input_source_filling_magic_number);
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
      goto LAB_001039bb;
    }
  } while( true );
  while (bVar1 = sptk::WriteStream<double>(0,vector_length,&data,(ostream *)&std::cout,(int *)0x0),
        bVar1) {
    bVar1 = sptk::InputSourceFillingMagicNumber::Get(&input_source_filling_magic_number,&data);
    if (!bVar1) {
      iVar3 = 0;
      goto LAB_00103baf;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
  std::operator<<((ostream *)&error_message_5,"Failed to write interpolated data");
  std::__cxx11::string::string((string *)&local_500,"magic_intpl",&local_501);
  sptk::PrintErrorMessage(&local_500,&error_message_5);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
  iVar3 = 1;
LAB_00103baf:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
LAB_00103bb9:
  sptk::InputSourceFillingMagicNumber::~InputSourceFillingMagicNumber
            (&input_source_filling_magic_number);
LAB_00103bc6:
  std::ifstream::~ifstream(&ifs);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  double magic_number(kDefaultMagicNumber);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("magic_intpl", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InputSourceFromStream input_source(false, vector_length, &input_stream);
  if (!input_source.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFromStream";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  sptk::InputSourceFillingMagicNumber input_source_filling_magic_number(
      magic_number, &input_source);
  if (!input_source_filling_magic_number.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFillingMagicNumber";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  std::vector<double> data;
  try {
    while (input_source_filling_magic_number.Get(&data)) {
      if (!sptk::WriteStream(0, vector_length, data, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write interpolated data";
        sptk::PrintErrorMessage("magic_intpl", error_message);
        return 1;
      }
    }
  } catch (...) {
    std::ostringstream error_message;
    error_message << "Cannot interpolate data";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  return 0;
}